

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(void *src,size_t srcSize)

{
  ushort uVar1;
  size_t sVar2;
  size_t sVar3;
  ushort *puVar4;
  ulong uVar5;
  unsigned_long_long uVar6;
  long lVar7;
  ulong uVar8;
  ushort uVar9;
  bool bVar10;
  ZSTD_frameSizeInfo ZVar11;
  ZSTD_frameHeader zfh;
  ZSTD_frameHeader local_38;
  
  if ((srcSize < 8) || ((*src & 0xfffffff0) != 0x184d2a50)) {
    sVar2 = ZSTD_getFrameHeader_advanced(&local_38,src,srcSize,ZSTD_f_zstd1);
    uVar6 = 0xfffffffffffffffe;
    if ((sVar2 < 0xffffffffffffff89) &&
       (sVar3 = 0xffffffffffffffb8, bVar10 = sVar2 == 0, sVar2 = sVar3, bVar10)) {
      puVar4 = (ushort *)((long)src + (ulong)local_38.headerSize);
      uVar5 = srcSize - local_38.headerSize;
      lVar7 = 0;
      do {
        if (uVar5 < 3) goto LAB_001624b9;
        uVar1 = *puVar4;
        uVar9 = uVar1 >> 1 & 3;
        uVar8 = 4;
        if (uVar9 != 1) {
          if (uVar9 == 3) {
            sVar2 = 0xffffffffffffffec;
            goto LAB_001624b9;
          }
          uVar8 = (ulong)((uint3)(CONCAT12((char)puVar4[1],uVar1) >> 3) + 3);
        }
        bVar10 = uVar5 < uVar8;
        uVar5 = uVar5 - uVar8;
        if (bVar10) goto LAB_001624b9;
        puVar4 = (ushort *)((long)puVar4 + uVar8);
        lVar7 = lVar7 + 1;
      } while ((uVar1 & 1) == 0);
      if (local_38.checksumFlag != 0) {
        if (uVar5 < 4) goto LAB_001624b9;
        puVar4 = puVar4 + 2;
      }
      sVar2 = (long)puVar4 - (long)src;
      uVar6 = lVar7 * (ulong)local_38.blockSizeMax;
      if (local_38.frameContentSize != 0xffffffffffffffff) {
        uVar6 = local_38.frameContentSize;
      }
    }
  }
  else if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
    uVar5 = (ulong)*(uint *)((long)src + 4) + 8;
    sVar2 = 0xffffffffffffffb8;
    if (uVar5 <= srcSize) {
      sVar2 = uVar5;
    }
    if (srcSize < sVar2 && sVar2 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(frameSizeInfo.compressedSize) || frameSizeInfo.compressedSize <= srcSize"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5b7a,"ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void *, size_t)");
    }
    uVar6 = 0;
  }
  else {
    sVar2 = 0xfffffffffffffff2;
    uVar6 = 0;
  }
LAB_001624b9:
  ZVar11.decompressedBound = uVar6;
  ZVar11.compressedSize = sVar2;
  return ZVar11;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.compressedSize = ip - ipstart;
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}